

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

char * GetExecutorResult(char *execResult,uint execResultSize,uint tempStackType,
                        uint *tempStackArrayBase,char *exSymbols,ExternTypeInfo *exTypes)

{
  double value_2;
  longlong value_1;
  int value;
  ExternTypeInfo *exTypes_local;
  char *exSymbols_local;
  uint *tempStackArrayBase_local;
  uint tempStackType_local;
  uint execResultSize_local;
  char *execResult_local;
  
  switch(tempStackType) {
  case 0:
    NULLC::SafeSprintf(execResult,(ulong)execResultSize,"no return value");
    break;
  case 1:
  case 2:
  case 3:
  case 4:
    NULLC::SafeSprintf(execResult,(ulong)execResultSize,"%d",(ulong)*tempStackArrayBase);
    break;
  case 5:
    NULLC::SafeSprintf(execResult,(ulong)execResultSize,"%lldL",*(undefined8 *)tempStackArrayBase);
    break;
  case 6:
  case 7:
    NULLC::SafeSprintf(execResult,(ulong)execResultSize,"%f",*(undefined8 *)tempStackArrayBase);
    break;
  default:
    NULLC::SafeSprintf(execResult,(ulong)execResultSize,"complex return value (%s)",
                       exSymbols + exTypes[tempStackType].offsetToName);
  }
  return execResult;
}

Assistant:

const char* GetExecutorResult(char *execResult, unsigned execResultSize, unsigned tempStackType, unsigned *tempStackArrayBase, char *exSymbols, ExternTypeInfo *exTypes)
{
	switch(tempStackType)
	{
	case NULLC_TYPE_VOID:
		NULLC::SafeSprintf(execResult, execResultSize, "no return value");
		break;
	case NULLC_TYPE_BOOL:
	case NULLC_TYPE_CHAR:
	case NULLC_TYPE_SHORT:
	case NULLC_TYPE_INT:
	{
		int value;
		memcpy(&value, tempStackArrayBase, sizeof(value));
		NULLC::SafeSprintf(execResult, execResultSize, "%d", value);
	}
		break;
	case NULLC_TYPE_LONG:
	{
		long long value;
		memcpy(&value, tempStackArrayBase, sizeof(value));
		NULLC::SafeSprintf(execResult, execResultSize, "%lldL", value);
	}
		break;
	case NULLC_TYPE_FLOAT:
	case NULLC_TYPE_DOUBLE:
	{
		double value;
		memcpy(&value, tempStackArrayBase, sizeof(value));
		NULLC::SafeSprintf(execResult, execResultSize, "%f", value);
	}
		break;
	default:
		NULLC::SafeSprintf(execResult, execResultSize, "complex return value (%s)", exSymbols + exTypes[tempStackType].offsetToName);
		break;
	}

	return execResult;
}